

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ei_kissfft_impl.h
# Opt level: O1

void __thiscall
Eigen::internal::kissfft_impl<double>::fwd
          (kissfft_impl<double> *this,Complex *dst,Scalar *src,int nfft)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_00;
  pointer pcVar1;
  mapped_type *pmVar2;
  mapped_type *this_01;
  size_t __n;
  long lVar3;
  double *pdVar4;
  int nfft_00;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined1 local_70 [16];
  complex<double> *local_60;
  double local_58;
  uint local_4c;
  long local_48;
  double local_40;
  double local_38;
  
  nfft_00 = nfft >> 1;
  if ((nfft & 3U) == 0) {
    local_4c = nfft >> 2;
    local_70._0_4_ = local_4c;
    local_60 = (complex<double> *)src;
    this_01 = std::
              map<int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
              ::operator[](&this->m_realTwiddles,(key_type *)local_70);
    if (local_70._0_4_ !=
        (int)((ulong)((long)(this_01->
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this_01->
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                (this_01,(long)(int)local_70._0_4_);
      if (0 < (int)local_70._0_4_) {
        local_58 = (double)(local_70._0_4_ * 2);
        lVar3 = 8;
        lVar5 = 0;
        do {
          lVar5 = lVar5 + 1;
          dVar8 = ((double)(int)lVar5 / local_58 + 0.5) * -3.141592653589793;
          dVar7 = cexp(0.0);
          pcVar1 = (this_01->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          *(double *)(pcVar1->_M_value + lVar3 + -8) = dVar7;
          *(double *)(pcVar1->_M_value + lVar3) = dVar8;
          lVar3 = lVar3 + 0x10;
        } while (lVar5 < (int)local_70._0_4_);
      }
    }
    pcVar1 = (this_01->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_70._0_4_ = nfft;
    pmVar2 = std::
             map<int,_Eigen::internal::kiss_cpx_fft<double>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
             ::operator[](&this->m_plans,(key_type *)local_70);
    if ((pmVar2->m_twiddles).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pmVar2->m_twiddles).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      kiss_cpx_fft<double>::make_twiddles(pmVar2,nfft_00,false);
      kiss_cpx_fft<double>::factorize(pmVar2,nfft_00);
    }
    kiss_cpx_fft<double>::work<std::complex<double>>(pmVar2,0,dst,local_60,1,1);
    local_40 = *(double *)dst->_M_value + *(double *)(dst->_M_value + 8);
    local_38 = *(double *)dst->_M_value - *(double *)(dst->_M_value + 8);
    local_48 = (long)nfft_00;
    if (0 < (int)local_4c) {
      uVar6 = (ulong)local_4c;
      pdVar4 = (double *)(dst[local_48 + -1]._M_value + 8);
      lVar3 = 0;
      do {
        local_58 = *(double *)(dst[1]._M_value + lVar3) + pdVar4[-1];
        local_60 = (complex<double> *)(*(double *)(dst[1]._M_value + lVar3 + 8) - *pdVar4);
        local_70._0_8_ = *(double *)(dst[1]._M_value + lVar3) - pdVar4[-1];
        local_70._8_8_ = *(double *)(dst[1]._M_value + lVar3 + 8) + *pdVar4;
        std::complex<double>::operator*=
                  ((complex<double> *)local_70,(complex<double> *)(pcVar1->_M_value + lVar3));
        *(double *)(dst[1]._M_value + lVar3) = (local_58 + (double)local_70._0_8_) * 0.5;
        *(double *)(dst[1]._M_value + lVar3 + 8) = ((double)local_60 + (double)local_70._8_8_) * 0.5
        ;
        pdVar4[-1] = (local_58 - (double)local_70._0_8_) * 0.5;
        *pdVar4 = ((double)local_60 - (double)local_70._8_8_) * -0.5;
        pdVar4 = pdVar4 + -2;
        lVar3 = lVar3 + 0x10;
      } while (uVar6 << 4 != lVar3);
    }
    *(double *)dst->_M_value = local_40;
    *(undefined8 *)(dst->_M_value + 8) = 0;
    *(double *)dst[local_48]._M_value = local_38;
    *(undefined8 *)(dst[local_48]._M_value + 8) = 0;
  }
  else {
    this_00 = &this->m_tmpBuf1;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              (this_00,(long)nfft);
    local_70._0_4_ = nfft * 2;
    pmVar2 = std::
             map<int,_Eigen::internal::kiss_cpx_fft<double>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
             ::operator[](&this->m_plans,(key_type *)local_70);
    if ((pmVar2->m_twiddles).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pmVar2->m_twiddles).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      kiss_cpx_fft<double>::make_twiddles(pmVar2,nfft,false);
      kiss_cpx_fft<double>::factorize(pmVar2,nfft);
    }
    kiss_cpx_fft<double>::work<double>
              (pmVar2,0,(this_00->
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,src,1,1);
    __n = (long)nfft_00 * 0x10 + 0x10;
    if (__n != 0) {
      memmove(dst,(this_00->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start,__n);
    }
  }
  return;
}

Assistant:

inline
    void fwd( Complex * dst,const Scalar * src,int nfft) 
    {
      if ( nfft&3  ) {
        // use generic mode for odd
        m_tmpBuf1.resize(nfft);
        get_plan(nfft,false).work(0, &m_tmpBuf1[0], src, 1,1);
        std::copy(m_tmpBuf1.begin(),m_tmpBuf1.begin()+(nfft>>1)+1,dst );
      }else{
        int ncfft = nfft>>1;
        int ncfft2 = nfft>>2;
        Complex * rtw = real_twiddles(ncfft2);

        // use optimized mode for even real
        fwd( dst, reinterpret_cast<const Complex*> (src), ncfft);
        Complex dc(dst[0].real() +  dst[0].imag());
        Complex nyquist(dst[0].real() -  dst[0].imag());
        int k;
        for ( k=1;k <= ncfft2 ; ++k ) {
          Complex fpk = dst[k];
          Complex fpnk = conj(dst[ncfft-k]);
          Complex f1k = fpk + fpnk;
          Complex f2k = fpk - fpnk;
          Complex tw= f2k * rtw[k-1];
          dst[k] =  (f1k + tw) * Scalar(.5);
          dst[ncfft-k] =  conj(f1k -tw)*Scalar(.5);
        }
        dst[0] = dc;
        dst[ncfft] = nyquist;
      }
    }